

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O3

void aes_enc(AES256_ctx *ctx,uchar *key,size_t key_len,uchar *bytes,size_t bytes_len,
            uchar *bytes_out)

{
  ulong uVar1;
  
  uVar1 = bytes_len >> 4;
  if (key_len == 0x20) {
    AES_setup(ctx->rk,key,8,0xe);
    if (0xf < bytes_len) {
      do {
        AES_encrypt((uchar *)ctx,(uchar *)0xe,(AES_KEY *)bytes_out);
        bytes_out = (uchar *)(((AES_KEY *)bytes_out)->rd_key + 4);
        uVar1 = uVar1 - 1;
      } while (uVar1 != 0);
    }
  }
  else if (key_len == 0x18) {
    AES_setup(ctx->rk,key,6,0xc);
    if (0xf < bytes_len) {
      do {
        AES_encrypt((uchar *)ctx,(uchar *)0xc,(AES_KEY *)bytes_out);
        bytes_out = (uchar *)(((AES_KEY *)bytes_out)->rd_key + 4);
        uVar1 = uVar1 - 1;
      } while (uVar1 != 0);
    }
  }
  else if ((key_len == 0x10) && (AES_setup(ctx->rk,key,4,10), 0xf < bytes_len)) {
    do {
      AES_encrypt((uchar *)ctx,(uchar *)0xa,(AES_KEY *)bytes_out);
      bytes_out = (uchar *)(((AES_KEY *)bytes_out)->rd_key + 4);
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  return;
}

Assistant:

static void aes_enc(AES256_ctx *ctx,
                    const unsigned char *key, size_t key_len,
                    const unsigned char *bytes, size_t bytes_len,
                    unsigned char *bytes_out)
{
    bytes_len /= AES_BLOCK_LEN;

    switch (key_len) {
    case AES_KEY_LEN_128:
        AES128_init((AES128_ctx *)ctx, key);
        AES128_encrypt((AES128_ctx *)ctx, bytes_len, bytes_out, bytes);
        break;

    case AES_KEY_LEN_192:
        AES192_init((AES192_ctx *)ctx, key);
        AES192_encrypt((AES192_ctx *)ctx, bytes_len, bytes_out, bytes);
        break;

    case AES_KEY_LEN_256:
        AES256_init(ctx, key);
        AES256_encrypt(ctx, bytes_len, bytes_out, bytes);
        break;
    }
}